

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  element_type *peVar3;
  int iVar4;
  ExpectationBase **ppEVar5;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  ExpectationBase *__tmp;
  ExpectationBase *next;
  ExpectationBase **local_50;
  iterator local_48;
  ExpectationBase **local_40;
  ExpectationBase *local_38;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ppEVar5 = (ExpectationBase **)operator_new(8);
  local_48._M_current = ppEVar5 + 1;
  *ppEVar5 = this;
  local_50 = ppEVar5;
  local_40 = local_48._M_current;
  do {
    pEVar1 = local_48._M_current[-1];
    local_48._M_current = local_48._M_current + -1;
    p_Var6 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    while ((_Rb_tree_header *)p_Var6 !=
           &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header) {
      pEVar2 = *(ExpectationBase **)(p_Var6 + 1);
      local_38 = pEVar2;
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      peVar3 = (pEVar2->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar4 = (*peVar3->_vptr_CardinalityInterface[4])(peVar3,(ulong)(uint)pEVar2->call_count_);
      if ((char)iVar4 == '\0') {
        bVar7 = false;
        ppEVar5 = local_50;
        goto LAB_0012a192;
      }
      if (local_48._M_current == local_40) {
        std::
        vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
        ::_M_realloc_insert<testing::internal::ExpectationBase_const*const&>
                  ((vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
                    *)&local_50,local_48,&local_38);
      }
      else {
        *local_48._M_current = local_38;
        local_48._M_current = local_48._M_current + 1;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      ppEVar5 = local_50;
    }
  } while (ppEVar5 != local_48._M_current);
  bVar7 = true;
LAB_0012a192:
  if (ppEVar5 != (ExpectationBase **)0x0) {
    operator_delete(ppEVar5,(long)local_40 - (long)ppEVar5);
  }
  return bVar7;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}